

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkDirFrame::ConstraintsLoadJacobians(ChLinkDirFrame *this)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  element_type *peVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  double *pdVar10;
  Index index;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> Jra;
  ChMatrix33<double> Jrb;
  ChMatrix33<double> Aow;
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChMatrix33<double> Aro;
  assign_op<double,_double> local_201;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_200;
  plainobjectbase_evaluator_data<double,_3> local_1e0;
  ChMatrix33<double> local_1d8;
  DstXprType local_190;
  undefined1 local_148 [16];
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  undefined1 local_118 [16];
  double local_108;
  ChQuaternion<double> local_100;
  undefined8 local_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ChMatrix33<double> local_b8;
  ChMatrix33<double> local_70;
  
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)local_148,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  ChMatrix33<double>::ChMatrix33(&local_70,&(this->m_csys).rot);
  peVar5 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  auVar4 = *(undefined1 (*) [32])(this->m_csys).rot.m_data;
  dVar1 = (this->m_csys).rot.m_data[1];
  auVar25._24_8_ = dVar1;
  auVar25._16_8_ = dVar1;
  dVar1 = *(double *)
           ((long)(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar3 = *(undefined1 (*) [16])
            ((long)(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
            0x10);
  auVar8 = vpermpd_avx2(auVar4,1);
  auVar9 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((this->m_csys).rot.m_data + 2)),0x15);
  auVar18._0_8_ = -dVar1;
  auVar18._8_8_ = 0x8000000000000000;
  auVar22._0_8_ = -auVar3._0_8_;
  auVar22._8_8_ = -auVar3._8_8_;
  auVar7 = vunpcklpd_avx(auVar18,auVar15);
  auVar20._16_16_ = auVar18;
  auVar20._0_16_ = auVar22;
  auVar17._16_16_ = auVar3;
  auVar17._0_16_ = auVar7;
  auVar14._0_8_ = auVar8._0_8_ * auVar7._0_8_;
  auVar14._8_8_ = auVar8._8_8_ * auVar7._8_8_;
  auVar14._16_8_ = auVar8._16_8_ * auVar3._0_8_;
  auVar14._24_8_ = auVar8._24_8_ * auVar3._8_8_;
  dVar1 = (peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar8._16_8_ = dVar1;
  auVar8._24_8_ = dVar1;
  auVar14 = vfmadd231pd_avx512vl(auVar14,auVar4,auVar8);
  dVar1 = *(double *)
           ((long)(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data +
           0x18);
  auVar24._24_8_ = dVar1;
  auVar24._16_8_ = dVar1;
  dVar1 = (this->m_csys).rot.m_data[2];
  auVar25._8_8_ = dVar1;
  auVar25._0_8_ = dVar1;
  auVar4 = vpermpd_avx2(auVar17,0x66);
  auVar4 = vshufpd_avx(auVar20,auVar4,9);
  auVar24._0_16_ = auVar22;
  auVar8 = vpermpd_avx2(auVar24,0x24);
  auVar3 = vfmadd213pd_fma(auVar25,auVar8,auVar14);
  auVar3 = vfmadd213pd_fma(auVar4,auVar9,ZEXT1632(auVar3));
  local_100.m_data = (double  [4])ZEXT1632(auVar3);
  ChMatrix33<double>::ChMatrix33(&local_b8,&local_100);
  peVar6 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_200.m_src = (SrcEvaluatorType *)&local_1d8;
  local_200.m_dstExpr = &local_190;
  local_200.m_dst = (DstEvaluatorType *)&local_1e0;
  dVar1 = *(double *)&peVar6->field_0xf8;
  uVar2 = *(undefined8 *)&(peVar6->super_ChNodeFEAxyz).field_0xf0;
  auVar21._8_8_ = uVar2;
  auVar21._0_8_ = uVar2;
  auVar23._8_8_ = *(undefined8 *)&peVar6->field_0x100;
  auVar23._0_8_ = *(undefined8 *)&peVar6->field_0x100;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  auVar16._0_8_ = dVar1 * local_130;
  auVar16._8_8_ = dVar1 * dStack_128;
  local_200.m_functor = &local_201;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_138;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 * local_120;
  auVar15 = vfmadd231sd_fma(auVar19,auVar21,auVar3);
  auVar3 = vfmadd231pd_fma(auVar16,auVar21,local_148);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_108;
  auVar7 = vfmadd231sd_fma(auVar15,auVar23,auVar7);
  auVar3 = vfmadd231pd_fma(auVar3,auVar23,local_118);
  auVar4._8_8_ = auVar3._8_8_;
  auVar4._0_8_ = auVar7._0_8_ ^ 0x8000000000000000;
  local_d8 = auVar3._0_8_ ^ 0x8000000000000000;
  uStack_d0 = auVar3._8_8_ ^ 0x8000000000000000;
  auVar4._16_8_ = auVar7._0_8_;
  auVar4._24_8_ = 0;
  local_100.m_data = (double  [4])(auVar4 << 0x40);
  local_e0 = 0;
  local_c8 = vmovlpd_avx(auVar3);
  local_c0 = 0;
  local_1e0.data = (double *)local_200.m_dstExpr;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_70;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_100;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_70;
  local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_100;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_200);
  local_200.m_dst = (DstEvaluatorType *)&local_b8;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_1d8,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_200);
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_200,&this->constraint1);
  if ((long)local_200.m_functor < 3) goto LAB_0061e33a;
  uVar11 = 3;
  if (((ulong)local_200.m_dst & 7) == 0) {
    uVar12 = -((uint)((ulong)local_200.m_dst >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 != 0) goto LAB_0061e199;
  }
  else {
LAB_0061e199:
    uVar13 = 0;
    do {
      (((Matrix<double,_3,_3,_1,_3,_3> *)
       &(local_200.m_dst)->
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar13] =
           *(double *)
            ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar13 * 8 + 0x18);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (uVar11 < 3) {
    do {
      (((Matrix<double,_3,_3,_1,_3,_3> *)
       &(local_200.m_dst)->
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar11] =
           *(double *)
            ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x18);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_200,&this->constraint2);
  if ((long)local_200.m_functor < 3) goto LAB_0061e33a;
  uVar11 = 3;
  if (((ulong)local_200.m_dst & 7) == 0) {
    uVar12 = -((uint)((ulong)local_200.m_dst >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 != 0) goto LAB_0061e20e;
  }
  else {
LAB_0061e20e:
    uVar13 = 0;
    do {
      (((Matrix<double,_3,_3,_1,_3,_3> *)
       &(local_200.m_dst)->
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar13] =
           *(double *)
            ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar13 * 8 + 0x30);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (uVar11 < 3) {
    do {
      (((Matrix<double,_3,_3,_1,_3,_3> *)
       &(local_200.m_dst)->
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array[uVar11] =
           *(double *)
            ((long)local_1d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x30);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_200,&this->constraint1);
  if ((long)local_200.m_functor < 6) goto LAB_0061e33a;
  uVar11 = 3;
  pdVar10 = (((Matrix<double,_3,_3,_1,_3,_3> *)
             &(local_200.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array + 3
  ;
  if (((ulong)pdVar10 & 7) == 0) {
    uVar12 = -((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 != 0) goto LAB_0061e280;
  }
  else {
LAB_0061e280:
    uVar13 = 0;
    do {
      pdVar10[uVar13] =
           local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar13 + 3];
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  if (uVar11 < 3) {
    do {
      pdVar10[uVar11] =
           local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11 + 3];
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_200,&this->constraint2);
  if ((long)local_200.m_functor < 6) {
LAB_0061e33a:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar11 = 3;
  pdVar10 = (((Matrix<double,_3,_3,_1,_3,_3> *)
             &(local_200.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.m_data.array + 3
  ;
  if (((ulong)pdVar10 & 7) == 0) {
    uVar12 = -((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar12 < 3) {
      uVar11 = (ulong)uVar12;
    }
    if (uVar12 == 0) goto LAB_0061e30c;
  }
  uVar13 = 0;
  do {
    pdVar10[uVar13] =
         local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[uVar13 + 6];
    uVar13 = uVar13 + 1;
  } while (uVar11 != uVar13);
LAB_0061e30c:
  if (uVar11 < 3) {
    do {
      pdVar10[uVar11] =
           local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11 + 6];
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
  }
  return;
}

Assistant:

void ChLinkDirFrame::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Aow(m_body->coord.rot);
    ChMatrix33<> Aro(m_csys.rot);
    ChMatrix33<> Arw(m_csys.rot >> m_body->coord.rot);

    ChVector<> Zo = Aow.transpose() * m_node->GetD();

    ChStarMatrix33<> ztilde(Zo);

    ChMatrix33<> Jrb = Aro.transpose() * ztilde;

    ChMatrix33<> Jra = Arw.transpose();

    constraint1.Get_Cq_a().segment(0, 3) = Jra.row(1);
    constraint2.Get_Cq_a().segment(0, 3) = Jra.row(2);

    constraint1.Get_Cq_b().segment(3, 3) = Jrb.row(1);
    constraint2.Get_Cq_b().segment(3, 3) = Jrb.row(2);
}